

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O2

Bdc_Man_t * Bdc_ManAlloc(Bdc_Par_t *pPars)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  Bdc_Man_t *p;
  Bdc_Fun_t *pBVar4;
  Vec_Int_t *pVVar5;
  Bdc_Fun_t **ppBVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  
  p = (Bdc_Man_t *)calloc(1,0x148);
  uVar1 = pPars->nVarsMax;
  if (0xd < uVar1 - 2) {
    __assert_fail("pPars->nVarsMax > 1 && pPars->nVarsMax < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                  ,0x49,"Bdc_Man_t *Bdc_ManAlloc(Bdc_Par_t *)");
  }
  uVar17 = (ulong)(uint)(1 << ((char)uVar1 - 5U & 0x1f));
  if (uVar1 < 6) {
    uVar17 = 1;
  }
  p->pPars = pPars;
  iVar15 = (int)uVar17;
  p->nWords = iVar15;
  p->nDivsLimit = 200;
  p->nNodesAlloc = 0x200;
  pBVar4 = (Bdc_Fun_t *)malloc(0x7000);
  p->pNodes = pBVar4;
  pVVar5 = Vec_IntAlloc(iVar15 << 0xc);
  uVar14 = 0;
  memset(pVVar5->pArray,0,(ulong)(uint)(iVar15 << 0xc) << 2);
  pVVar5->nSize = 0;
  p->vMemory = pVVar5;
  iVar3 = 1 << ((byte)pPars->nVarsMax & 0x1f);
  p->nTableSize = iVar3;
  ppBVar6 = (Bdc_Fun_t **)calloc(1,(long)iVar3 << 3);
  p->pTable = ppBVar6;
  pVVar5 = Vec_IntAlloc(0x100);
  p->vSpots = pVVar5;
  uVar1 = pPars->nVarsMax;
  lVar12 = (long)(int)uVar1;
  uVar16 = 1 << ((char)uVar1 - 5U & 0x1f);
  if (lVar12 < 6) {
    uVar16 = 1;
  }
  ppvVar7 = (void **)malloc(((long)(int)uVar16 * 4 + 8) * lVar12);
  uVar13 = 0;
  if (0 < (int)uVar1) {
    uVar13 = (ulong)uVar1;
  }
  lVar12 = lVar12 << 3;
  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    ppvVar7[uVar14] = (void *)((long)ppvVar7 + lVar12);
    lVar12 = lVar12 + (long)(int)uVar16 * 4;
  }
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nSize = uVar1;
  pVVar8->nCap = uVar1;
  pVVar8->pArray = ppvVar7;
  uVar11 = 0;
  uVar14 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar14 = uVar11;
  }
  for (; uVar11 != uVar13; uVar11 = uVar11 + 1) {
    pvVar2 = ppvVar7[uVar11];
    if (uVar11 < 5) {
      for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined4 *)((long)pvVar2 + uVar10 * 4) = (&DAT_007be840)[uVar11];
      }
    }
    else {
      for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
        *(uint *)((long)pvVar2 + uVar10 * 4) =
             -(uint)((1 << ((char)uVar11 - 5U & 0x1f) & (uint)uVar10) != 0);
      }
    }
  }
  p->vTruths = pVVar8;
  puVar9 = (uint *)malloc((ulong)(uint)(iVar15 * 4) << 2);
  p->puTemp1 = puVar9;
  puVar9 = puVar9 + uVar17;
  p->puTemp2 = puVar9;
  p->puTemp3 = puVar9 + uVar17;
  p->puTemp4 = puVar9 + uVar17 + uVar17;
  p->pIsfOL = &p->IsfOL;
  Bdc_IsfStart(p,&p->IsfOL);
  p->pIsfOR = &p->IsfOR;
  Bdc_IsfStart(p,&p->IsfOR);
  p->pIsfAL = &p->IsfAL;
  Bdc_IsfStart(p,&p->IsfAL);
  p->pIsfAR = &p->IsfAR;
  Bdc_IsfStart(p,&p->IsfAR);
  return p;
}

Assistant:

Bdc_Man_t * Bdc_ManAlloc( Bdc_Par_t * pPars )
{
    Bdc_Man_t * p;
    p = ABC_ALLOC( Bdc_Man_t, 1 );
    memset( p, 0, sizeof(Bdc_Man_t) );
    assert( pPars->nVarsMax > 1 && pPars->nVarsMax < 16 );
    p->pPars = pPars;
    p->nWords = Kit_TruthWordNum( pPars->nVarsMax );
    p->nDivsLimit = 200;
    // internal nodes
    p->nNodesAlloc = 512;
    p->pNodes = ABC_ALLOC( Bdc_Fun_t, p->nNodesAlloc );
    // memory
    p->vMemory = Vec_IntStart( 8 * p->nWords * p->nNodesAlloc );
    Vec_IntClear(p->vMemory);
    // set up hash table
    p->nTableSize = (1 << p->pPars->nVarsMax);
    p->pTable = ABC_ALLOC( Bdc_Fun_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Bdc_Fun_t *) * p->nTableSize );
    p->vSpots = Vec_IntAlloc( 256 );
    // truth tables
    p->vTruths = Vec_PtrAllocTruthTables( p->pPars->nVarsMax );
    p->puTemp1 = ABC_ALLOC( unsigned, 4 * p->nWords );
    p->puTemp2 = p->puTemp1 + p->nWords;
    p->puTemp3 = p->puTemp2 + p->nWords;
    p->puTemp4 = p->puTemp3 + p->nWords;
    // start the internal ISFs
    p->pIsfOL = &p->IsfOL;  Bdc_IsfStart( p, p->pIsfOL );
    p->pIsfOR = &p->IsfOR;  Bdc_IsfStart( p, p->pIsfOR );
    p->pIsfAL = &p->IsfAL;  Bdc_IsfStart( p, p->pIsfAL );
    p->pIsfAR = &p->IsfAR;  Bdc_IsfStart( p, p->pIsfAR );   
    return p; 
}